

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

void addMeanSquareError<CoreML::Specification::NeuralNetworkClassifier>
               (Model *m,NeuralNetworkClassifier *nn,char *lossName,char *mseInputName,
               char *targetName)

{
  char *pcVar1;
  NetworkUpdateParameters *pNVar2;
  TypeUnion this;
  Arena *pAVar3;
  ArenaStringPtr *pAVar4;
  ModelDescription *pMVar5;
  FeatureDescription *pFVar6;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this_00;
  string *psVar7;
  FeatureDescription *trainingInput;
  FeatureDescription output;
  MeanSquaredErrorLossLayer *mseLossLayer;
  LossLayer *lossLayer;
  NetworkUpdateParameters *updateParams;
  char *targetName_local;
  char *mseInputName_local;
  char *lossName_local;
  NeuralNetworkClassifier *nn_local;
  Model *m_local;
  TypeUnion local_40;
  string *local_38;
  FeatureDescription *local_30;
  char **local_28;
  MeanSquaredErrorLossLayer *local_20;
  NetworkUpdateParameters **local_18;
  CachedSize local_10;
  undefined4 uStack_c;
  
  updateParams = (NetworkUpdateParameters *)targetName;
  targetName_local = mseInputName;
  mseInputName_local = lossName;
  lossName_local = (char *)nn;
  nn_local = (NeuralNetworkClassifier *)m;
  pNVar2 = CoreML::Specification::NeuralNetworkClassifier::mutable_updateparams(nn);
  this.pipelineclassifier_ =
       (PipelineClassifier *)CoreML::Specification::NetworkUpdateParameters::add_losslayers(pNVar2);
  pcVar1 = mseInputName_local;
  m_local = (Model *)&mseInputName_local;
  local_40.pipelineclassifier_ = this.pipelineclassifier_;
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation
                     ((MessageLite *)this.pipelineclassifier_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)&(this.pipelineclassifier_)->pipeline_,pcVar1,pAVar3);
  output._40_8_ =
       CoreML::Specification::LossLayer::mutable_meansquarederrorlosslayer
                 ((LossLayer *)this.pipelineclassifier_);
  pcVar1 = targetName_local;
  local_28 = &targetName_local;
  pAVar4 = &((MeanSquaredErrorLossLayer *)output._40_8_)->input_;
  local_20 = (MeanSquaredErrorLossLayer *)output._40_8_;
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation((MessageLite *)output._40_8_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar4,pcVar1,pAVar3);
  pNVar2 = updateParams;
  local_10.size_.super___atomic_base<int>._M_i =
       output._cached_size_.size_.super___atomic_base<int>._M_i;
  uStack_c = output._44_4_;
  local_18 = &updateParams;
  pAVar4 = (ArenaStringPtr *)(output._40_8_ + 0x18);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation((MessageLite *)output._40_8_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar4,pNVar2,pAVar3);
  pMVar5 = CoreML::Specification::Model::description((Model *)nn_local);
  pFVar6 = CoreML::Specification::ModelDescription::output(pMVar5,0);
  CoreML::Specification::FeatureDescription::FeatureDescription
            ((FeatureDescription *)&trainingInput,pFVar6);
  pMVar5 = CoreML::Specification::Model::mutable_description((Model *)nn_local);
  this_00 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar5);
  pFVar6 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (this_00);
  CoreML::Specification::FeatureDescription::CopyFrom(pFVar6,(FeatureDescription *)&trainingInput);
  psVar7 = CoreML::Specification::MeanSquaredErrorLossLayer::target_abi_cxx11_
                     ((MeanSquaredErrorLossLayer *)output._40_8_);
  local_38 = psVar7;
  local_30 = pFVar6;
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar6->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(&pFVar6->name_,psVar7,pAVar3);
  CoreML::Specification::FeatureDescription::~FeatureDescription
            ((FeatureDescription *)&trainingInput);
  return;
}

Assistant:

void addMeanSquareError(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *mseInputName, const char *targetName) {

    // set a MSE loss layer
    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input(mseInputName);
    mseLossLayer->set_target(targetName);

    auto output = m.description().output(0);
    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->CopyFrom(output);
    trainingInput->set_name(mseLossLayer->target());

}